

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

_Bool subj_alt_hostcheck(Curl_easy *data,char *match_pattern,size_t matchlen,char *hostname,
                        size_t hostlen,char *dispname)

{
  _Bool _Var1;
  char *dispname_local;
  size_t hostlen_local;
  char *hostname_local;
  size_t matchlen_local;
  char *match_pattern_local;
  Curl_easy *data_local;
  
  _Var1 = Curl_cert_hostcheck(match_pattern,matchlen,hostname,hostlen);
  if (_Var1) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data," subjectAltName: host \"%s\" matched cert\'s \"%s\"",dispname,match_pattern);
    }
    data_local._7_1_ = true;
  }
  else {
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

static bool subj_alt_hostcheck(struct Curl_easy *data,
                               const char *match_pattern,
                               size_t matchlen,
                               const char *hostname,
                               size_t hostlen,
                               const char *dispname)
{
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)dispname;
  (void)data;
#endif
  if(Curl_cert_hostcheck(match_pattern, matchlen, hostname, hostlen)) {
    infof(data, " subjectAltName: host \"%s\" matched cert's \"%s\"",
          dispname, match_pattern);
    return TRUE;
  }
  return FALSE;
}